

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::minorChooseRow(HEkkDual *this)

{
  reference pvVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  long lVar4;
  long in_RDI;
  double dVar5;
  MFinish *finish;
  double upperOut;
  double lowerOut;
  double valueOut;
  MChoice *workChoice;
  double infeasMerit;
  double infeasEdWt;
  double infeasValue;
  HighsInt iRow;
  HighsInt ich;
  double bestMerit;
  double local_70;
  int local_14;
  double local_10;
  
  *(undefined4 *)(in_RDI + 0x14c8) = 0xffffffff;
  local_10 = 0.0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x14c0); local_14 = local_14 + 1) {
    if ((-1 < *(int *)(in_RDI + 0x14d8 + (long)local_14 * 0x248)) &&
       (dVar5 = *(double *)(in_RDI + (long)local_14 * 0x248 + 0x14f8) /
                *(double *)(in_RDI + (long)local_14 * 0x248 + 0x1500), local_10 < dVar5)) {
      *(int *)(in_RDI + 0x14c8) = local_14;
      local_10 = dVar5;
    }
  }
  *(undefined4 *)(in_RDI + 0x7b0) = 0xffffffff;
  if (*(int *)(in_RDI + 0x14c8) != -1) {
    puVar3 = (undefined4 *)(in_RDI + 0x14d8 + (long)*(int *)(in_RDI + 0x14c8) * 0x248);
    *(undefined4 *)(in_RDI + 0x7b0) = *puVar3;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 0x10) + 0x2978),
                        (long)*(int *)(in_RDI + 0x7b0));
    *(value_type *)(in_RDI + 0x7b4) = *pvVar1;
    local_70 = *(double *)(puVar3 + 6);
    if (*(double *)(puVar3 + 2) < *(double *)(puVar3 + 4)) {
      local_70 = *(double *)(puVar3 + 4);
    }
    *(double *)(in_RDI + 0x7c0) = *(double *)(puVar3 + 2) - local_70;
    uVar2 = 1;
    if (*(double *)(in_RDI + 0x7c0) < 0.0) {
      uVar2 = 0xffffffff;
    }
    *(undefined4 *)(in_RDI + 0x7b8) = uVar2;
    lVar4 = in_RDI + 0x2718 + (long)*(int *)(in_RDI + 0x14cc) * 0x78;
    *(undefined4 *)(lVar4 + 0x28) = *(undefined4 *)(in_RDI + 0x7b0);
    *(undefined4 *)(lVar4 + 0x2c) = *(undefined4 *)(in_RDI + 0x7b4);
    *(undefined4 **)(lVar4 + 0x60) = puVar3 + 0xe;
    *(undefined4 **)(lVar4 + 0x68) = puVar3 + 0x3a;
    *(undefined4 **)(lVar4 + 0x70) = puVar3 + 0x66;
    *(undefined8 *)(lVar4 + 0x58) = *(undefined8 *)(puVar3 + 10);
    *puVar3 = 0xffffffff;
  }
  return;
}

Assistant:

void HEkkDual::minorChooseRow() {
  /**
   * 1. Find which to go out
   *        Because we had other checking code
   *        We know current best is OK to be used
   */
  multi_iChoice = -1;
  double bestMerit = 0;
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    const HighsInt iRow = multi_choice[ich].row_out;
    if (iRow < 0) continue;
    double infeasValue = multi_choice[ich].infeasValue;
    double infeasEdWt = multi_choice[ich].infeasEdWt;
    double infeasMerit = infeasValue / infeasEdWt;
    if (bestMerit < infeasMerit) {
      bestMerit = infeasMerit;
      multi_iChoice = ich;
    }
  }

  /**
   * 2. Obtain other info for current sub-optimization choice
   */
  row_out = kNoRowChosen;
  if (multi_iChoice != -1) {
    MChoice* workChoice = &multi_choice[multi_iChoice];

    // Assign useful variables
    row_out = workChoice->row_out;
    variable_out = ekk_instance_.basis_.basicIndex_[row_out];
    double valueOut = workChoice->baseValue;
    double lowerOut = workChoice->baseLower;
    double upperOut = workChoice->baseUpper;
    delta_primal = valueOut - (valueOut < lowerOut ? lowerOut : upperOut);
    move_out = delta_primal < 0 ? -1 : 1;

    // Assign buffers
    MFinish* finish = &multi_finish[multi_nFinish];
    finish->row_out = row_out;
    finish->variable_out = variable_out;
    finish->row_ep = &workChoice->row_ep;
    finish->col_aq = &workChoice->col_aq;
    finish->col_BFRT = &workChoice->col_BFRT;
    // Save the edge weight - over-written later when using Devex
    finish->EdWt = workChoice->infeasEdWt;

    // Disable current row
    workChoice->row_out = kNoRowChosen;
  }
}